

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UText * utext_openUTF8_63(UText *ut,char *s,int64_t length,UErrorCode *status)

{
  UText *pUVar1;
  char *pcVar2;
  
  if (U_ZERO_ERROR < *status) {
    return (UText *)0x0;
  }
  pcVar2 = "";
  if (s != (char *)0x0 || length != 0) {
    pcVar2 = s;
  }
  if (length - 0x80000000U < 0xffffffff7fffffff || pcVar2 == (char *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    pUVar1 = (UText *)0x0;
  }
  else {
    pUVar1 = utext_setup_63(ut,0x1e0,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      pUVar1->pFuncs = &utf8Funcs;
      pUVar1->context = pcVar2;
      pUVar1->b = (int32_t)length;
      pUVar1->c = (int32_t)length;
      if (length < 0) {
        pUVar1->c = 0;
        *(byte *)&pUVar1->providerProperties = (byte)pUVar1->providerProperties | 2;
      }
      pUVar1->p = pUVar1->pExtra;
      pUVar1->q = (void *)((long)pUVar1->pExtra + 0xf0);
    }
  }
  return pUVar1;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }